

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol_io.c
# Opt level: O3

int KINGetWorkSpace(void *kinmem,long *lenrw,long *leniw)

{
  int iVar1;
  
  if (kinmem == (void *)0x0) {
    iVar1 = -1;
    KINProcessError((KINMem)0x0,-1,"KINSOL","KINGetWorkSpace","kinsol_mem = NULL illegal.");
  }
  else {
    *lenrw = *(long *)((long)kinmem + 0x1c0);
    *leniw = *(long *)((long)kinmem + 0x1c8);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int KINGetWorkSpace(void *kinmem, long int *lenrw, long int *leniw)
{
  KINMem kin_mem;

  if (kinmem == NULL) {
    KINProcessError(NULL, KIN_MEM_NULL, "KINSOL", "KINGetWorkSpace", MSG_NO_MEM);
    return(KIN_MEM_NULL);
  }

  kin_mem = (KINMem) kinmem;

  *lenrw = lrw;
  *leniw = liw;

  return(KIN_SUCCESS);
}